

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
* __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::insert_descend(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                 *this,node *n,key_type *key,data_type *value,key_type *splitkey,node **splitnode)

{
  long lVar1;
  bool bVar2;
  node *in_RCX;
  leaf_node *in_RDX;
  leaf_node *in_RSI;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *in_RDI;
  key_type *in_R8;
  data_type *in_R9;
  node **unaff_retaddr;
  long *in_stack_00000008;
  int slot_1;
  leaf_node *leaf;
  inner_node *splitinner;
  int slot;
  node *newchild;
  key_type newkey;
  inner_node *inner;
  leaf_node *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *this_00;
  undefined7 in_stack_ffffffffffffff50;
  bool in_stack_ffffffffffffff57;
  iterator local_a8;
  bool local_81;
  iterator local_80;
  int local_5c;
  leaf_node *local_58;
  int local_44;
  key_type local_40;
  data_type local_38;
  leaf_node *plVar3;
  
  this_00 = in_RDI;
  local_58 = in_RDX;
  bVar2 = node::isleafnode(&in_RDX->super_node);
  if (bVar2) {
    local_5c = btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
               ::
               find_lower<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
                         ((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                           *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_RSI,
                          (key_type *)this_00);
    if ((local_5c < (int)(uint)(local_58->super_node).slotuse) &&
       (bVar2 = key_equal(this_00,(key_type *)in_RDI,
                          (key_type *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
       , bVar2)) {
      iterator::iterator((iterator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28,0);
      local_81 = false;
      std::
      pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
      ::
      pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool,_true>
                ((pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
                  *)in_RDI,&local_80,&local_81);
    }
    else {
      bVar2 = leaf_node::isfull(local_58);
      if ((bVar2) &&
         (split_leaf_node((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                           *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_RSI,
                          (key_type *)this_00,&in_RDI->m_root),
         (int)(uint)(local_58->super_node).slotuse <= local_5c)) {
        local_5c = local_5c - (uint)(local_58->super_node).slotuse;
        local_58 = (leaf_node *)*in_stack_00000008;
      }
      std::copy_backward<double*,double*>
                ((double *)this_00,(double *)in_RDI,
                 (double *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
      ::data_copy_backward<BufferNode<double,long>**,BufferNode<double,long>**>
                ((BufferNode<double,_long> **)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (BufferNode<double,_long> **)in_stack_ffffffffffffff28,
                 (BufferNode<double,_long> **)0x112e15);
      local_58->slotkey[local_5c] = *(key_type *)in_RCX;
      local_58->slotdata[local_5c] = (data_type)*in_R8;
      (local_58->super_node).slotuse = (local_58->super_node).slotuse + 1;
      if (((in_stack_00000008 != (long *)0x0) && (local_58 != (leaf_node *)*in_stack_00000008)) &&
         (local_5c == (local_58->super_node).slotuse - 1)) {
        *in_R9 = *(data_type *)in_RCX;
      }
      iterator::iterator((iterator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28,0);
      std::
      pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
      ::
      pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool,_true>
                ((pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
                  *)in_RDI,&local_a8,(bool *)&stack0xffffffffffffff57);
    }
  }
  else {
    local_38 = (data_type)0x0;
    local_40 = 0.0;
    plVar3 = local_58;
    local_44 = btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
               ::
               find_lower<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::inner_node>
                         ((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                           *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (inner_node *)in_RSI,(key_type *)this_00);
    insert_descend((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                    *)plVar3,in_RCX,in_R8,in_R9,(key_type *)local_58,unaff_retaddr);
    if (local_40 != 0.0) {
      bVar2 = inner_node::isfull((inner_node *)local_58);
      plVar3 = local_58;
      if (bVar2) {
        split_inner_node((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                          *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                         (inner_node *)in_RSI,(key_type *)this_00,&in_RDI->m_root,
                         in_stack_ffffffffffffff34);
        if ((local_44 == (local_58->super_node).slotuse + 1) &&
           ((local_58->super_node).slotuse < *(ushort *)(*in_stack_00000008 + 2))) {
          lVar1 = *in_stack_00000008;
          local_58->slotkey[(ulong)(local_58->super_node).slotuse - 2] = (key_type)*in_R9;
          local_58->slotkey[(long)(int)((local_58->super_node).slotuse + 1) + 0xe] =
               *(key_type *)(lVar1 + 0x88);
          (local_58->super_node).slotuse = (local_58->super_node).slotuse + 1;
          *(key_type *)(lVar1 + 0x88) = local_40;
          *in_R9 = local_38;
          return (pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
                  *)this_00;
        }
        plVar3 = local_58;
        if ((int)((local_58->super_node).slotuse + 1) <= local_44) {
          local_44 = local_44 - ((local_58->super_node).slotuse + 1);
          plVar3 = (leaf_node *)*in_stack_00000008;
        }
      }
      std::copy_backward<double*,double*>
                ((double *)this_00,(double *)in_RDI,
                 (double *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      std::
      copy_backward<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**,stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**>
                (&this_00->m_root,&in_RDI->m_root,
                 (node **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      plVar3->slotkey[(long)local_44 + -2] = (key_type)local_38;
      plVar3->slotkey[(long)(local_44 + 1) + 0xe] = local_40;
      (plVar3->super_node).slotuse = (plVar3->super_node).slotuse + 1;
    }
  }
  return (pair<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::iterator,_bool>
          *)this_00;
}

Assistant:

std::pair<iterator, bool> insert_descend(node* n,
                                                 const key_type& key, const data_type& value,
                                                 key_type* splitkey, node** splitnode)
        {
            if (!n->isleafnode())
            {
                inner_node *inner = static_cast<inner_node*>(n);

                key_type newkey = key_type();
                node *newchild = NULL;

                int slot = find_lower(inner, key);

                BTREE_PRINT("btree::insert_descend into " << inner->childid[slot]);

                std::pair<iterator, bool> r = insert_descend(inner->childid[slot],
                                                             key, value, &newkey, &newchild);

                if (newchild)
                {
                    BTREE_PRINT("btree::insert_descend newchild with key " << newkey << " node " << newchild << " at slot " << slot);

                    if (inner->isfull())
                    {
                        split_inner_node(inner, splitkey, splitnode, slot);

                        BTREE_PRINT("btree::insert_descend done split_inner: putslot: " << slot << " putkey: " << newkey << " upkey: " << *splitkey);

#ifdef BTREE_DEBUG
                        if (debug)
                    {
                        print_node(std::cout, inner);
                        print_node(std::cout, *splitnode);
                    }
#endif

                        // check if insert slot is in the split sibling node
                        BTREE_PRINT("btree::insert_descend switch: " << slot << " > " << inner->slotuse+1);

                        if (slot == inner->slotuse+1 && inner->slotuse < (*splitnode)->slotuse)
                        {
                            // special case when the insert slot matches the split
                            // place between the two nodes, then the insert key
                            // becomes the split key.

                            BTREE_ASSERT(inner->slotuse + 1 < innerslotmax);

                            inner_node *splitinner = static_cast<inner_node*>(*splitnode);

                            // move the split key and it's datum into the left node
                            inner->slotkey[inner->slotuse] = *splitkey;
                            inner->childid[inner->slotuse+1] = splitinner->childid[0];
                            inner->slotuse++;

                            // set new split key and move corresponding datum into right node
                            splitinner->childid[0] = newchild;
                            *splitkey = newkey;

                            return r;
                        }
                        else if (slot >= inner->slotuse+1)
                        {
                            // in case the insert slot is in the newly create split
                            // node, we reuse the code below.

                            slot -= inner->slotuse+1;
                            inner = static_cast<inner_node*>(*splitnode);
                            BTREE_PRINT("btree::insert_descend switching to splitted node " << inner << " slot " << slot);
                        }
                    }

                    // move items and put pointer to child node into correct slot
                    BTREE_ASSERT(slot >= 0 && slot <= inner->slotuse);

                    std::copy_backward(inner->slotkey + slot, inner->slotkey + inner->slotuse,
                                       inner->slotkey + inner->slotuse+1);
                    std::copy_backward(inner->childid + slot, inner->childid + inner->slotuse+1,
                                       inner->childid + inner->slotuse+2);

                    inner->slotkey[slot] = newkey;
                    inner->childid[slot + 1] = newchild;
                    inner->slotuse++;
                }

                return r;
            }
            else // n->isleafnode() == true
            {
                leaf_node *leaf = static_cast<leaf_node*>(n);

                int slot = find_lower(leaf, key);

                if (!allow_duplicates && slot < leaf->slotuse && key_equal(key, leaf->slotkey[slot])) {
                    return std::pair<iterator, bool>(iterator(leaf, slot), false);
                }

                if (leaf->isfull())
                {
                    split_leaf_node(leaf, splitkey, splitnode);

                    // check if insert slot is in the split sibling node
                    if (slot >= leaf->slotuse)
                    {
                        slot -= leaf->slotuse;
                        leaf = static_cast<leaf_node*>(*splitnode);
                    }
                }

                // move items and put data item into correct data slot
                BTREE_ASSERT(slot >= 0 && slot <= leaf->slotuse);

                std::copy_backward(leaf->slotkey + slot, leaf->slotkey + leaf->slotuse,
                                   leaf->slotkey + leaf->slotuse+1);
                data_copy_backward(leaf->slotdata + slot, leaf->slotdata + leaf->slotuse,
                                   leaf->slotdata + leaf->slotuse+1);

                leaf->slotkey[slot] = key;
                if (!used_as_set) leaf->slotdata[slot] = value;
                leaf->slotuse++;

                if (splitnode && leaf != *splitnode && slot == leaf->slotuse-1)
                {
                    // special case: the node was split, and the insert is at the
                    // last slot of the old node. then the splitkey must be
                    // updated.
                    *splitkey = key;
                }

                return std::pair<iterator, bool>(iterator(leaf, slot), true);
            }
        }